

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O3

bool dg::pta::PointerAnalysisFS::mergeMaps
               (MemoryMapT *mm,MemoryMapT *from,PointsToSetT *overwritten)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  __uniq_ptr_impl<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *this;
  pointer __p;
  _Base_ptr p_Var3;
  bool bVar4;
  MemoryObject *to;
  _Rb_tree_header *p_Var5;
  PSNode *fromTarget;
  PSNode *local_38;
  
  p_Var3 = (from->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(from->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var5) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      local_38 = *(PSNode **)(p_Var3 + 1);
      this = (__uniq_ptr_impl<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
             std::
             map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
             ::operator[](mm,&local_38);
      to = (this->_M_t).
           super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
           .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl;
      if (to == (MemoryObject *)0x0) {
        __p = (pointer)operator_new(0x38);
        __p->node = local_38;
        p_Var1 = &(__p->pointsTo)._M_t._M_impl.super__Rb_tree_header;
        (__p->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (__p->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (__p->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        (__p->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        (__p->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        std::__uniq_ptr_impl<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::
        reset(this,__p);
        to = (this->_M_t).
             super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
             .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl;
      }
      bVar2 = mergeObjects(local_38,to,(MemoryObject *)p_Var3[1]._M_parent,overwritten);
      bVar4 = (bool)(bVar4 | bVar2);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  return bVar4;
}

Assistant:

static bool mergeMaps(MemoryMapT *mm, MemoryMapT *from,
                          PointsToSetT *overwritten) {
        bool changed = false;
        for (auto &it : *from) {
            PSNode *fromTarget = it.first;
            std::unique_ptr<MemoryObject> &toMo = (*mm)[fromTarget];
            if (toMo == nullptr)
                toMo.reset(new MemoryObject(fromTarget));

            changed |= mergeObjects(fromTarget, toMo.get(), it.second.get(),
                                    overwritten);
        }

        return changed;
    }